

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O2

void __thiscall chipemu::implementation::nmos::stabilize_network(nmos *this)

{
  ushort id;
  
  for (id = 1; id <= this->desc_nodes_count; id = id + 1) {
    changed_push(this,id);
  }
  recalc_nodes(this);
  return;
}

Assistant:

void
nmos::stabilize_network() noexcept
{
    for (uint16_t i = 1; i <= node_count(); ++i) {
        changed_push(i);
    }
    recalc_nodes();
}